

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O1

int writebintable(fitsfile *fptr,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long nrows;
  float elapcpu;
  double elapse;
  char extname [11];
  char *tunit [2];
  char *tform [2];
  char *ttype [2];
  long local_90;
  float local_84;
  double local_80;
  undefined7 local_78;
  undefined4 uStack_71;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  
  local_78 = 0x545f6465657053;
  uStack_71 = 0x747365;
  local_48 = "first";
  pcStack_40 = "second";
  local_58 = "1J";
  pcStack_50 = "1J";
  local_68 = 0x104087;
  uStack_64 = 0;
  uStack_60 = 0x104087;
  uStack_5c = 0;
  lVar2 = 2500000;
  iVar1 = ffcrtb(fptr,2,2500000,2,&local_48,&local_58,&local_68,&local_78,status);
  if (iVar1 == 0) {
    ffgrsz(fptr,&local_90,status);
    lVar4 = 20000;
    if (local_90 < 20000) {
      lVar4 = local_90;
    }
    local_90 = lVar4;
    printf("Write %7drow x %dcol bintable %4ld rows/loop:",2500000,2);
    marktime(status);
    lVar4 = 1;
    do {
      lVar3 = local_90;
      if (lVar2 <= local_90) {
        lVar3 = lVar2;
      }
      ffpclj(fptr,1,lVar4,1,lVar3,sarray,status);
      ffpclj(fptr,2,lVar4,1,lVar3,sarray,status);
      lVar4 = lVar4 + lVar3;
      lVar2 = lVar2 - lVar3;
    } while (lVar2 != 0);
    ffflus(fptr,status);
    gettime(&local_80,&local_84,status);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0,local_80,
           (double)(float)(((double)local_84 / local_80) * 100.0),(double)(float)(20.0 / local_80));
    return *status;
  }
  printerror(*status);
}

Assistant:

int writebintable (fitsfile *fptr, int *status)

    /*********************************************************/
    /* Create a binary table extension containing 3 columns  */
    /*********************************************************/
{
    int tfields = 2;
    long nremain, ntodo, firstrow = 1, firstelem = 1, nrows;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    char extname[] = "Speed_Test";           /* extension name */

    /* define the name, datatype, and physical units for the columns */
    char *ttype[] = { "first", "second" };
    char *tform[] = {"1J",       "1J"   };
    char *tunit[] = { " ",       " "    };

    /* append a new empty binary table onto the FITS file */

    if ( fits_create_tbl( fptr, BINARY_TBL, BROWS, tfields, ttype, tform,
                tunit, extname, status) )
         printerror( *status );

    /* get table row size and optimum number of rows to write per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    nremain = BROWS;

    printf("Write %7drow x %dcol bintable %4ld rows/loop:", BROWS, tfields,
       nrows);
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffpclj(fptr, 1, firstrow, firstelem, ntodo, sarray, status);
      ffpclj(fptr, 2, firstrow, firstelem, ntodo, sarray, status);
      firstrow += ntodo;
      nremain -= ntodo;
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}